

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall DMessageBoxMenu::HandleResult(DMessageBoxMenu *this,bool res)

{
  TObjPtr<DMenu> *obj;
  DMenu *pDVar1;
  DMessageBoxMenu *this_00;
  int local_1c;
  
  obj = &(this->super_DMenu).mParentMenu;
  pDVar1 = GC::ReadBarrier<DMenu>((DMenu **)obj);
  if ((pDVar1 != (DMenu *)0x0) && (this->mMessageMode == 0)) {
    if ((this->mAction).Index == 0) {
      pDVar1 = GC::ReadBarrier<DMenu>((DMenu **)obj);
      (*(pDVar1->super_DObject)._vptr_DObject[8])(pDVar1,(ulong)(res ^ 0xd),0);
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
      this_00 = this;
    }
    else {
      this_00 = this;
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
      if (res) {
        local_1c = (this->mAction).Index;
        this_00 = (DMessageBoxMenu *)&stack0xffffffffffffffe4;
        M_SetMenu((FName *)this_00,-1);
      }
    }
    CloseSound(this_00);
  }
  return;
}

Assistant:

void DMessageBoxMenu::HandleResult(bool res)
{
	if (mParentMenu != NULL)
	{
		if (mMessageMode == 0)
		{
			if (mAction == NAME_None) 
			{
				mParentMenu->MenuEvent(res? MKEY_MBYes : MKEY_MBNo, false);
				Close();
			}
			else 
			{
				Close();
				if (res) M_SetMenu(mAction, -1);
			}
			CloseSound();
		}
	}
}